

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O0

int main(void)

{
  Rect rct;
  Rect rct_00;
  Rect rct_01;
  Rect rct_02;
  initializer_list<plot::GenericPoint<long>_> __l;
  Size char_sz;
  TerminalInfo *pTVar1;
  BrailleCanvas *pBVar2;
  iterator first;
  iterator last;
  ostream *this;
  allocator<plot::GenericPoint<long>_> local_469;
  GenericPoint<long> local_468;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  iterator local_420;
  size_type local_418;
  undefined1 local_410 [8];
  vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_> points;
  initializer_list<plot::GenericPoint<long>_> local_3b0;
  GenericPoint<long> local_3a0;
  Size local_390;
  GenericPoint<long> local_380;
  Size local_370;
  Point local_360;
  Size local_350;
  Point local_340;
  Point local_330;
  anon_class_1_0_00000001 local_319;
  long local_318;
  long lStack_310;
  long local_308;
  long lStack_300;
  undefined8 local_2f8;
  Coord vCenter;
  long lStack_2e8;
  float amplitude;
  long lStack_2e0;
  long local_2d8;
  long lStack_2d0;
  undefined1 auStack_2c8 [8];
  Rect strokeArea;
  Coord yStop;
  Coord yStart;
  Coord xStop;
  Coord xStart;
  GenericPoint<long> local_278;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  Rect greyEllipseBoundingBox;
  Point local_218;
  Point local_208;
  Point local_1f8;
  Point local_1e8;
  Point local_1d8;
  Point local_1c8;
  Point local_1b8 [2];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  Rect filledRectangle;
  Point lowerRight;
  Point upperLeft;
  Color local_130;
  Color local_120;
  TerminalInfo local_110;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  long local_b8;
  long lStack_b0;
  undefined1 local_a8 [8];
  BrailleCanvas canvas;
  Size canvasCellSize;
  Coord canvasCellRows;
  Coord canvasCellCols;
  
  canvas.term_.background_color.a = 9.80909e-44;
  canvas.term_.term_ = 0;
  local_b8 = 0x46;
  lStack_b0 = 0x14;
  plot::Color::Color(&local_120,0.9,0.9,0.9,1.0);
  plot::Color::Color(&local_130,0.0,0.0,0.0,1.0);
  plot::TerminalInfo::TerminalInfo(&local_110,1,None,local_120,local_130);
  pTVar1 = plot::TerminalInfo::detect<void>(&local_110);
  local_c8 = *(undefined8 *)&(pTVar1->background_color).a;
  local_e8._0_4_ = pTVar1->mode;
  local_e8._4_4_ = (pTVar1->foreground_color).r;
  uStack_e0._0_4_ = (pTVar1->foreground_color).g;
  uStack_e0._4_4_ = (pTVar1->foreground_color).b;
  local_d8 = *(undefined8 *)&(pTVar1->foreground_color).a;
  uStack_d0._0_4_ = (pTVar1->background_color).g;
  uStack_d0._4_4_ = (pTVar1->background_color).b;
  char_sz.y = lStack_b0;
  char_sz.x = local_b8;
  plot::BrailleCanvas::BrailleCanvas((BrailleCanvas *)local_a8,char_sz,*pTVar1);
  filledRectangle.p2.y = 0x28;
  filledRectangle.p1.y = 0x28;
  filledRectangle.p2.x = 0x28;
  uStack_178 = 0xb;
  filledRectangle.p1.x = 0xb;
  local_188 = 0x28;
  uStack_180 = 0x28;
  local_198 = 0xb;
  uStack_190 = 0xb;
  rct.p1.y = 0xb;
  rct.p1.x = 0xb;
  rct.p2.x = 0x28;
  rct.p2.y = 0x28;
  plot::BrailleCanvas::rect
            ((BrailleCanvas *)local_a8,(Color *)plot::palette::firebrick,
             (Color *)plot::palette::blueviolet,rct,Over);
  pBVar2 = plot::BrailleCanvas::push((BrailleCanvas *)local_a8);
  plot::GenericPoint<long>::GenericPoint(local_1b8,0xc,0x11);
  plot::GenericPoint<long>::GenericPoint(&local_1c8,0x11,0x27);
  pBVar2 = plot::BrailleCanvas::line
                     (pBVar2,(Color *)plot::palette::limegreen,local_1b8[0],local_1c8,Over);
  plot::GenericPoint<long>::GenericPoint(&local_1d8,0x11,0x27);
  plot::GenericPoint<long>::GenericPoint(&local_1e8,0x27,0x22);
  pBVar2 = plot::BrailleCanvas::line
                     (pBVar2,(Color *)plot::palette::limegreen,local_1d8,local_1e8,Over);
  plot::GenericPoint<long>::GenericPoint(&local_1f8,0x27,0x22);
  plot::GenericPoint<long>::GenericPoint(&local_208,0x22,0xc);
  pBVar2 = plot::BrailleCanvas::line
                     (pBVar2,(Color *)plot::palette::limegreen,local_1f8,local_208,Over);
  plot::GenericPoint<long>::GenericPoint(&local_218,0x22,0xc);
  plot::GenericPoint<long>::GenericPoint
            ((GenericPoint<long> *)&greyEllipseBoundingBox.p2.y,0xc,0x11);
  plot::BrailleCanvas::line
            (pBVar2,(Color *)plot::palette::limegreen,local_218,stack0xfffffffffffffdd8,Over);
  plot::BrailleCanvas::pop((BrailleCanvas *)local_a8,ClipDst);
  greyEllipseBoundingBox.p1.y = 0x4b;
  greyEllipseBoundingBox.p2.x = 0x29;
  uStack_248 = 0x2d;
  greyEllipseBoundingBox.p1.x = 0xb;
  local_258 = 0x4b;
  uStack_250 = 0x29;
  local_268 = 0x2d;
  uStack_260 = 0xb;
  rct_00.p1.y = 0xb;
  rct_00.p1.x = 0x2d;
  rct_00.p2.x = 0x4b;
  rct_00.p2.y = 0x29;
  plot::BrailleCanvas::ellipse
            ((BrailleCanvas *)local_a8,(Color *)plot::palette::slategrey,rct_00,Over);
  plot::GenericPoint<long>::GenericPoint(&local_278,0x3c,0x1a);
  plot::GenericPoint<long>::GenericPoint((GenericPoint<long> *)&xStart,10,0xc);
  plot::BrailleCanvas::ellipse
            ((BrailleCanvas *)local_a8,(Color *)plot::palette::green,(Color *)plot::palette::yellow,
             &local_278,(Size *)&xStart,Over);
  strokeArea.p2.y = 0x47;
  strokeArea.p1.y = 0x47;
  strokeArea.p2.x = 0x47;
  auStack_2c8 = (undefined1  [8])0xc;
  strokeArea.p1.x = 0x2e;
  plot::BrailleCanvas::rect
            ((BrailleCanvas *)local_a8,(Color *)plot::palette::lightcyan,(Rect *)auStack_2c8,Over);
  plot::BrailleCanvas::push((BrailleCanvas *)local_a8);
  local_2d8 = strokeArea.p1.y;
  lStack_2d0 = strokeArea.p2.x;
  lStack_2e8 = (long)auStack_2c8;
  lStack_2e0 = strokeArea.p1.x;
  rct_01.p1.y = strokeArea.p1.x;
  rct_01.p1.x = (long)auStack_2c8;
  rct_01.p2.x = strokeArea.p1.y;
  rct_01.p2.y = strokeArea.p2.x;
  plot::BrailleCanvas::stroke<std::pair<long,long>(&)(long)>
            ((BrailleCanvas *)local_a8,(Color *)plot::palette::royalblue,rct_01,sinStrokeFunction,
             Over);
  vCenter._4_4_ = 0x41200000;
  local_2f8 = 0x3a;
  local_308 = strokeArea.p1.y;
  lStack_300 = strokeArea.p2.x;
  local_318 = (long)auStack_2c8;
  lStack_310 = strokeArea.p1.x;
  rct_02.p1.y = strokeArea.p1.x;
  rct_02.p1.x = (long)auStack_2c8;
  rct_02.p2.x = strokeArea.p1.y;
  rct_02.p2.y = strokeArea.p2.x;
  plot::BrailleCanvas::fill<main::__0>
            ((BrailleCanvas *)local_a8,(Color *)plot::palette::salmon,rct_02,&local_319,ClipSrc);
  plot::BrailleCanvas::pop((BrailleCanvas *)local_a8,Over);
  plot::GenericPoint<long>::GenericPoint(&local_330,0,0);
  plot::BrailleCanvas::dot((BrailleCanvas *)local_a8,(Color *)plot::palette::orange,local_330,Over);
  local_350 = plot::BrailleCanvas::size((BrailleCanvas *)local_a8);
  plot::GenericPoint<long>::GenericPoint(&local_340,0,local_350.y + -1);
  plot::BrailleCanvas::dot((BrailleCanvas *)local_a8,(Color *)plot::palette::purple,local_340,Over);
  local_370 = plot::BrailleCanvas::size((BrailleCanvas *)local_a8);
  plot::GenericPoint<long>::GenericPoint(&local_360,local_370.x + -1,0);
  plot::BrailleCanvas::dot((BrailleCanvas *)local_a8,(Color *)plot::palette::gold,local_360,Over);
  local_390 = plot::BrailleCanvas::size((BrailleCanvas *)local_a8);
  plot::GenericPoint<long>::GenericPoint(&local_3a0,1,1);
  local_380 = plot::operator-(&local_390,&local_3a0);
  plot::BrailleCanvas::dot((BrailleCanvas *)local_a8,(Color *)plot::palette::indigo,local_380,Over);
  points.super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x62;
  local_3b0._M_array =
       (iterator)
       &points.
        super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3b0._M_len = 4;
  plot::BrailleCanvas::path
            ((BrailleCanvas *)local_a8,(Color *)plot::palette::deepskyblue,&local_3b0,Over);
  local_438 = 0x52;
  uStack_430 = 0x37;
  local_448 = 100;
  uStack_440 = 0x41;
  local_458 = 0x50;
  uStack_450 = 0x44;
  local_468.x = 0x62;
  local_468.y = 0x32;
  local_420 = &local_468;
  local_418 = 4;
  std::allocator<plot::GenericPoint<long>_>::allocator(&local_469);
  __l._M_len = local_418;
  __l._M_array = local_420;
  std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>::vector
            ((vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_> *)
             local_410,__l,&local_469);
  std::allocator<plot::GenericPoint<long>_>::~allocator(&local_469);
  first = std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>::begin
                    ((vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_> *
                     )local_410);
  last = std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>::end
                   ((vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_> *)
                    local_410);
  plot::BrailleCanvas::
  path<__gnu_cxx::__normal_iterator<plot::GenericPoint<long>*,std::vector<plot::GenericPoint<long>,std::allocator<plot::GenericPoint<long>>>>>
            ((BrailleCanvas *)local_a8,(Color *)plot::palette::mediumseagreen,
             (__normal_iterator<plot::GenericPoint<long>_*,_std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>_>
              )first._M_current,
             (__normal_iterator<plot::GenericPoint<long>_*,_std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>_>
              )last._M_current,Over);
  this = plot::operator<<((ostream *)&std::cout,(BrailleCanvas *)local_a8);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>::~vector
            ((vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_> *)
             local_410);
  plot::BrailleCanvas::~BrailleCanvas((BrailleCanvas *)local_a8);
  return 0;
}

Assistant:

int main() {
    // Each Braille Canvas is made up of cells that are 2x4 points
    // Points are switched on and off individually, but color is stored
    // per cell.
    constexpr Coord canvasCellCols = 70;
    constexpr Coord canvasCellRows = 20;
    constexpr Size canvasCellSize(canvasCellCols, canvasCellRows);

    BrailleCanvas canvas(canvasCellSize, TerminalInfo().detect());
    // The grid of the canvas is 70*2 x 20*4 or 140x80 points
    // so all future coordinates for where to draw objects are
    // relative to the 140x80 points with the origin (i.e. Point{0,0}) in the upper
    // left hand corner.

    // First draw a rectangle with a 'firebrick' outline and 'blueviolet' filling from point
    // location 11,11 to 40,40
    constexpr Point upperLeft(11, 11);
    constexpr Point lowerRight(40, 40);
    constexpr Rect filledRectangle(upperLeft, lowerRight);
    canvas.rect(palette::firebrick, palette::blueviolet, filledRectangle);

    // Draw lines in 'limegreen' overlayed onto the canvas
    // note that each method returns a reference to the object so
    // that commands can be easily chained together.

    // Push the current image to a stack and create a new clean image
    canvas.push()
          .line(palette::limegreen, { 12, 17 }, { 17, 39 })
          .line(palette::limegreen, { 17, 39 }, { 39, 34 })
          .line(palette::limegreen, { 39, 34 }, { 34, 12 })
          .line(palette::limegreen, { 34, 12 }, { 12, 17 });

    // Pop the previous image from the stack and composite the current
    // one onto it
    //
    // Most drawing commands can take an optional compositing operation
    // as their last argument. Three operations are available:
    //   - TerminalOp::Over = Paint source over destination, mix cell colors
    //   - TerminalOp::ClipDst = Erase destination cell where source is not empty
    //   - TerminalOp::ClipSrc = Ignore source cell where destination is not empty
    canvas.pop(TerminalOp::ClipDst);

    // Draw an ellipse in a bounding box from {0,0} to {30,30} offset by {45,11}
    constexpr Rect greyEllipseBoundingBox = Rect({ 30, 30 }) + Point(45, 11);
    canvas.ellipse(palette::slategrey, greyEllipseBoundingBox);
    // Draw an elipse with green outline, filled with yellow centered at {60,26} with  semi-axes of {10,12}
    canvas.ellipse(palette::green, palette::yellow, { 60, 26 }, { 10, 12 });

    // Bounding box for where the stroke functions are rendered.
    constexpr Coord xStart = 12;
    constexpr Coord xStop  = 71;
    constexpr Coord yStart = 46;
    constexpr Coord yStop  = 71;
    constexpr Rect strokeArea({ xStart, yStart }, { xStop, yStop });
    canvas.rect(palette::lightcyan, strokeArea);

    canvas.push();

    // Stroke a custom shaped line in 'royalblue' color
    //
    // The function 'sinStrokeFunction' will be evaluated at each value in [xStart, xStop]
    // and stroke in the color of 'royalblue' will be rendered for those coordinates.
    // Output will be clipped to range [yStart, yStop].
    canvas.stroke(palette::royalblue, strokeArea, sinStrokeFunction);

    constexpr float amplitude = 10;
    constexpr Coord vCenter = (yStop + yStart) / 2;

    // Fill cosine area using a custom lambda function returning true for
    // points inside the colored area.
    canvas.fill(palette::salmon, strokeArea, [](Point p) {
        Coord value = vCenter - std::lround(amplitude*std::cos(2*3.141592f*((p.x - xStart)/30.0f)));

        if (value < vCenter)
            return p.y <= vCenter && p.y >= value;
        else
            return p.y >= vCenter && p.y <= value;
     }, TerminalOp::ClipSrc);
     canvas.pop(TerminalOp::Over);

    // Place a dot in each corner of the pixel grid
    canvas.dot(palette::orange, { 0, 0 });
    canvas.dot(palette::purple, { 0, canvas.size().y - 1 });
    canvas.dot(palette::gold,   { canvas.size().x - 1, 0 });
    canvas.dot(palette::indigo, canvas.size() - Point(1, 1));

    // Draw a chain of lines from a sequence of points (initializer list)
    canvas.path(palette::deepskyblue, {
        { 98, 30 },
        { 80, 12 },
        { 100, 15 },
        { 82, 25 }
    });

    std::vector<Point> points{
        { 98, 50 },
        { 80, 68 },
        { 100, 65 },
        { 82, 55 }
    };

    // Draw a chain of lines from a sequence of points (iterators)
    canvas.path(palette::mediumseagreen, points.begin(), points.end());

    // Write the canvas to stdout
    std::cout << canvas << std::endl;

    return 0;
}